

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.h
# Opt level: O2

int prune_ref(MV_REFERENCE_FRAME *ref_frame,uint *ref_display_order_hint,
             uint frame_display_order_hint,int *ref_frame_list)

{
  int iVar1;
  int i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 != 2; uVar2 = uVar2 + 1) {
    iVar1 = ref_frame_list[uVar2];
    if (((long)iVar1 != -1) &&
       (((iVar1 == *ref_frame || (iVar1 == ref_frame[1])) &&
        ((int)ref_display_order_hint[(long)iVar1 + -1] < (int)frame_display_order_hint)))) break;
  }
  return (int)(uVar2 < 2);
}

Assistant:

static inline int prune_ref(const MV_REFERENCE_FRAME *const ref_frame,
                            const unsigned int *const ref_display_order_hint,
                            const unsigned int frame_display_order_hint,
                            const int *ref_frame_list) {
  for (int i = 0; i < 2; i++) {
    if (ref_frame_list[i] == NONE_FRAME) continue;

    if (ref_frame[0] == ref_frame_list[i] ||
        ref_frame[1] == ref_frame_list[i]) {
      if (av1_encoder_get_relative_dist(
              ref_display_order_hint[ref_frame_list[i] - LAST_FRAME],
              frame_display_order_hint) < 0)
        return 1;
    }
  }
  return 0;
}